

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_bonsai_nlm.hpp
# Opt level: O1

void __thiscall
poplar::compact_bonsai_nlm<int,8ul>::
expand<poplar::plain_bonsai_trie<90u,poplar::hash::vigna_hasher>::node_map>
          (compact_bonsai_nlm<int,8ul> *this,node_map *pos_map)

{
  void *pvVar1;
  long lVar2;
  undefined1 auVar3 [16];
  uint64_t uVar4;
  uint uVar5;
  uint32_t capa_bits;
  ulong chunk_id;
  ulong i;
  char_range new_slice;
  compact_bonsai_nlm<int,_8UL> local_88;
  undefined1 local_48 [16];
  pointer local_38;
  
  lVar2 = (*(long *)(this + 8) - *(long *)this) * 2;
  capa_bits = 0;
  if (lVar2 != 0) {
    capa_bits = 0x40 - (int)LZCOUNT(lVar2 + -1);
  }
  compact_bonsai_nlm<int,_8UL>::compact_bonsai_nlm(&local_88,capa_bits);
  if ((pos_map->map_).size_ != 0) {
    i = 0;
    do {
      uVar4 = plain_bonsai_trie<90U,_poplar::hash::vigna_hasher>::node_map::operator[](pos_map,i);
      chunk_id = i >> 3;
      uVar5 = (uint)i & 7;
      if (uVar4 != 0xffffffffffffffff) {
        new_slice = compact_bonsai_nlm<int,_8UL>::get_slice_
                              ((compact_bonsai_nlm<int,_8UL> *)this,chunk_id,(ulong)uVar5);
        if (new_slice.begin != new_slice.end) {
          compact_bonsai_nlm<int,_8UL>::set_slice_
                    (&local_88,uVar4 >> 3,(ulong)((uint)uVar4 & 7),new_slice);
        }
      }
      if (uVar5 == 7) {
        pvVar1 = *(void **)(*(long *)this + chunk_id * 8);
        *(undefined8 *)(*(long *)this + chunk_id * 8) = 0;
        if (pvVar1 != (void *)0x0) {
          operator_delete__(pvVar1);
        }
      }
      i = i + 1;
    } while (i < (pos_map->map_).size_);
  }
  local_88.size_ = *(uint64_t *)(this + 0x30);
  local_88.label_bytes_ = *(uint64_t *)(this + 0x38);
  auVar3 = *(undefined1 (*) [16])this;
  local_38 = *(pointer *)(this + 0x10);
  *(pointer *)this =
       local_88.ptrs_.
       super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  *(pointer *)(this + 8) =
       local_88.ptrs_.
       super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  *(pointer *)(this + 0x10) =
       local_88.ptrs_.
       super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  local_48._8_8_ = SUB168(ZEXT816(0),4);
  local_88.ptrs_.
  super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.ptrs_.
  super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_48._8_8_;
  local_88.ptrs_.
  super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_48 = auVar3;
  std::
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ::~vector((vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
             *)local_48);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(this + 0x18),
             &local_88.chunks_);
  *(uint64_t *)(this + 0x30) = local_88.size_;
  *(uint64_t *)(this + 0x38) = local_88.label_bytes_;
  compact_bonsai_nlm<int,_8UL>::~compact_bonsai_nlm(&local_88);
  return;
}

Assistant:

void expand(const T& pos_map) {
        this_type new_ls(bit_tools::ceil_log2(ptrs_.size() * ChunkSize * 2));

        for (uint64_t pos = 0; pos < pos_map.size(); ++pos) {
            auto [chunk_id, pos_in_chunk] = decompose_value<ChunkSize>(pos);
            uint64_t new_pos = pos_map[pos];
            if (new_pos != UINT64_MAX) {
                auto orig_slice = get_slice_(chunk_id, pos_in_chunk);
                if (!orig_slice.empty()) {
                    auto [new_chunk_id, new_pos_in_chunk] = decompose_value<ChunkSize>(new_pos);
                    new_ls.set_slice_(new_chunk_id, new_pos_in_chunk, orig_slice);
                }
            }
            if (pos_in_chunk == ChunkSize - 1) {
                ptrs_[chunk_id].reset();
            }
        }

        new_ls.size_ = size_;
#ifdef POPLAR_EXTRA_STATS
        new_ls.max_length_ = max_length_;
        new_ls.sum_length_ = sum_length_;
#endif
        new_ls.label_bytes_ = label_bytes_;
        *this = std::move(new_ls);
    }